

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O2

void * stdout_new(t_symbol *s,int argc,t_atom *argv)

{
  t_atom *ptVar1;
  t_pd *pp_Var2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  bool bVar5;
  
  pp_Var2 = pd_new(stdout_class);
LAB_001a3c7b:
  do {
    while( true ) {
      bVar5 = argc == 0;
      argc = argc + -1;
      if (bVar5) {
        ptVar3 = gensym("#pd_binary_stdio");
        if (ptVar3->s_thing != (_class **)0x0) {
          *(undefined4 *)(pp_Var2 + 6) = 3;
        }
        return pp_Var2;
      }
      ptVar1 = argv + 1;
      ptVar3 = atom_getsymbol(argv);
      ptVar4 = gensym("-cr");
      argv = ptVar1;
      if (ptVar4 != ptVar3) break;
      *(undefined4 *)(pp_Var2 + 6) = 1;
    }
    ptVar4 = gensym("-b");
    if (ptVar4 != ptVar3) {
      ptVar4 = gensym("-binary");
      if (ptVar4 != ptVar3) {
        ptVar4 = gensym("-f");
        if (ptVar4 != ptVar3) {
          ptVar4 = gensym("-flush");
          if (ptVar4 != ptVar3) {
            ptVar4 = gensym("-nf");
            if (ptVar4 != ptVar3) {
              ptVar4 = gensym("-noflush");
              if (ptVar4 != ptVar3) {
                gensym("");
                goto LAB_001a3c7b;
              }
            }
            *(undefined4 *)((long)pp_Var2 + 0x34) = 0;
            goto LAB_001a3c7b;
          }
        }
        *(undefined4 *)((long)pp_Var2 + 0x34) = 1;
        goto LAB_001a3c7b;
      }
    }
    *(undefined4 *)(pp_Var2 + 6) = 2;
  } while( true );
}

Assistant:

static void *stdout_new(t_symbol*s, int argc, t_atom*argv)
{
    t_stdout *x = (t_stdout *)pd_new(stdout_class);
        /* for some reason in MS windows we have to flush standard out here -
        otherwise these outputs get out of order from the ones from pdsched.c
        over in ../pd~.  I'm guessing mingw (with its different C runtime
        support) will handle this correctly and so am only ifdeffing this on
        Microsoft C compiler.  It's an efficiency hit, possibly a serious
        one. */
#ifdef _MSC_VER
    x->x_flush = 1;
#endif

    while(argc--)
    {
        s = atom_getsymbol(argv++);
        if (gensym("-cr") == s)
        {
                /* No-semicolon mode */
            x->x_mode = MODE_CR;
        }
        else if ((gensym("-b") == s) || (gensym("-binary") == s))
        {
                /* Binary mode:
                   no extra characters (semicolons, CR,...) is appended
                 */
            x->x_mode = MODE_BIN;
        }
        else if ((gensym("-f") == s) || (gensym("-flush") == s))
        {
            x->x_flush = 1;
        }
        else if ((gensym("-nf") == s) || (gensym("-noflush") == s))
        {
            x->x_flush = 0;
        }
        else if (gensym("") != s)
        {
                /* unknown mode; ignore it */
        }
    }
    if (gensym("#pd_binary_stdio")->s_thing)
        x->x_mode = MODE_PDTILDE;
    return (x);
}